

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O2

bool __thiscall OSToken::deleteObject(OSToken *this,OSObject *object)

{
  Directory *pDVar1;
  OSObject *pOVar2;
  int iVar3;
  iterator iVar4;
  ObjectFile *this_00;
  char cVar5;
  OSObject *object_local;
  string objectFilename;
  MutexLocker lock;
  string lockFilename;
  string local_68 [32];
  string local_48 [32];
  
  if (this->valid != true) {
    return false;
  }
  object_local = object;
  iVar4 = std::
          _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
          ::find(&(this->objects)._M_t,&object_local);
  if ((_Rb_tree_header *)iVar4._M_node != &(this->objects)._M_t._M_impl.super__Rb_tree_header) {
    MutexLocker::MutexLocker(&lock,this->tokenMutex);
    pOVar2 = object_local;
    if ((object_local == (OSObject *)0x0) ||
       (this_00 = (ObjectFile *)
                  __dynamic_cast(object_local,&OSObject::typeinfo,&ObjectFile::typeinfo,0),
       this_00 == (ObjectFile *)0x0)) {
      cVar5 = '\0';
      softHSMLog(3,"deleteObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x18d,"Object type not compatible with this token class 0x%08X",pOVar2);
    }
    else {
      ObjectFile::invalidate(this_00);
      ObjectFile::getFilename_abi_cxx11_(&objectFilename,this_00);
      pDVar1 = this->tokenDir;
      std::__cxx11::string::string(local_48,(string *)&objectFilename);
      iVar3 = Directory::remove(pDVar1,(char *)local_48);
      std::__cxx11::string::~string(local_48);
      if ((char)iVar3 == '\0') {
        cVar5 = '\0';
        softHSMLog(3,"deleteObject",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x19b,"Failed to delete object file %s",objectFilename._M_dataplus._M_p);
      }
      else {
        ObjectFile::getLockname_abi_cxx11_(&lockFilename,this_00);
        pDVar1 = this->tokenDir;
        std::__cxx11::string::string(local_68,(string *)&lockFilename);
        iVar3 = Directory::remove(pDVar1,(char *)local_68);
        std::__cxx11::string::~string(local_68);
        cVar5 = (char)iVar3;
        if (cVar5 == '\0') {
          softHSMLog(3,"deleteObject",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x1a6,"Failed to delete lock file %s",lockFilename._M_dataplus._M_p);
        }
        else {
          std::
          _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
          ::erase(&(this->objects)._M_t,&object_local);
          softHSMLog(7,"deleteObject",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x1ad,"Deleted object %s",objectFilename._M_dataplus._M_p);
          Generation::update(this->gen);
          Generation::commit(this->gen);
        }
        std::__cxx11::string::~string((string *)&lockFilename);
      }
      std::__cxx11::string::~string((string *)&objectFilename);
    }
    MutexLocker::~MutexLocker(&lock);
    return (bool)cVar5;
  }
  softHSMLog(3,"deleteObject",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
             ,0x183,"Cannot delete non-existent object 0x%08X",object_local);
  return false;
}

Assistant:

bool OSToken::deleteObject(OSObject* object)
{
	if (!valid) return false;

	if (objects.find(object) == objects.end())
	{
		ERROR_MSG("Cannot delete non-existent object 0x%08X", object);

		return false;
	}

	MutexLocker lock(tokenMutex);

	ObjectFile* fileObject = dynamic_cast<ObjectFile*>(object);
	if (fileObject == NULL)
	{
		ERROR_MSG("Object type not compatible with this token class 0x%08X", object);

		return false;
	}

	// Invalidate the object instance
	fileObject->invalidate();

	// Retrieve the filename of the object
	std::string objectFilename = fileObject->getFilename();

	// Attempt to delete the file
	if (!tokenDir->remove(objectFilename))
	{
		ERROR_MSG("Failed to delete object file %s", objectFilename.c_str());

		return false;
	}

	// Retrieve the filename of the lock
	std::string lockFilename = fileObject->getLockname();

	// Attempt to delete the lock
	if (!tokenDir->remove(lockFilename))
	{
		ERROR_MSG("Failed to delete lock file %s", lockFilename.c_str());

		return false;
	}

	objects.erase(object);

	DEBUG_MSG("Deleted object %s", objectFilename.c_str());

	gen->update();

	gen->commit();

	return true;
}